

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O3

void __thiscall soplex::SoPlexBase<double>::SoPlexBase(SoPlexBase<double> *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  Statistics **p;
  SPxSolverBase<double> *this_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_01;
  undefined1 *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  Statistics *this_03;
  Settings *newSettings;
  rational_type *prVar3;
  cpp_dec_float<50U,_int,_void> *pcVar4;
  SLUFactor<double> *this_04;
  SPxOut *pSVar5;
  int i;
  long lVar6;
  Tolerances *__tmp;
  shared_ptr<soplex::Tolerances> local_3e0;
  VarStatus **local_3d0;
  VarStatus **local_3c8;
  VarStatus **local_3c0;
  VarStatus **local_3b8;
  VarStatus **local_3b0;
  VarStatus **local_3a8;
  VarStatus **local_3a0;
  VarStatus **local_398;
  VarStatus **local_390;
  VarStatus **local_388;
  int **local_380;
  SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_378;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_370;
  SPxBoundFlippingRT<double> *local_368;
  SLUFactor<double> *local_360;
  SPxOut *local_358;
  longlong local_350;
  shared_ptr<soplex::Tolerances> local_348;
  Rational *local_338;
  Rational *local_330;
  SolRational *local_328;
  SolRational *local_320;
  SolBase<double> *local_318;
  Array<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_*>
  *local_310;
  DSVectorRational *local_308;
  VectorRational *local_300;
  DSVectorRational *local_2f8;
  LPColSetRational *local_2f0;
  SLUFactorRational *local_2e8;
  SPxLPBase<double> *local_2e0;
  Presol<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_2d8;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_2d0;
  SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_2c8;
  SPxSteepExPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_2c0;
  SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_2b8;
  SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_2b0;
  SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_2a8;
  SPxAutoPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_2a0;
  SPxSteepExPR<double> *local_298;
  SPxSteepPR<double> *local_290;
  SPxDevexPR<double> *local_288;
  SPxParMultPR<double> *local_280;
  SPxAutoPR<double> *local_278;
  SPxVectorST<double> *local_270;
  SPxSumST<double> *local_268;
  SPxWeightST<double> *local_260;
  Presol<double> *local_258;
  SPxMainSM<double> *local_250;
  shared_ptr<soplex::Tolerances> local_248;
  shared_ptr<soplex::Tolerances> local_238;
  element_type *local_228;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_220;
  element_type *local_218;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_210;
  element_type *local_208;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_200;
  shared_ptr<soplex::Tolerances> local_1f8;
  element_type *local_1e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1e0;
  element_type *local_1d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1d0;
  element_type *local_1c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1c0;
  shared_ptr<soplex::Tolerances> local_1b8;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined5 uStack_190;
  undefined3 uStack_18b;
  undefined5 local_188;
  undefined3 uStack_183;
  int local_180;
  bool local_17c;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined5 uStack_150;
  undefined3 uStack_14b;
  undefined5 local_148;
  undefined3 uStack_143;
  int local_140;
  bool local_13c;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined5 uStack_110;
  undefined3 uStack_10b;
  undefined5 local_108;
  undefined3 uStack_103;
  int local_100;
  bool local_fc;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined5 uStack_d0;
  undefined3 uStack_cb;
  undefined5 local_c8;
  undefined3 uStack_c3;
  int local_c0;
  bool local_bc;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined5 uStack_90;
  undefined3 uStack_8b;
  undefined5 local_88;
  undefined3 uStack_83;
  int local_80;
  bool local_7c;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined5 uStack_50;
  undefined3 uStack_4b;
  undefined5 local_48;
  undefined3 uStack_43;
  int local_40;
  bool local_3c;
  undefined8 local_38;
  
  this->_vptr_SoPlexBase = (_func_int **)&PTR__SoPlexBase_0069d810;
  local_358 = &this->spxout;
  SPxOut::SPxOut(local_358);
  (this->_rationalPosInfty).m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_data.la[0] = 0;
  (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_statistics = (Statistics *)0x0;
  this->_currentSettings = (Settings *)0x0;
  (this->_rationalPosInfty).m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_limbs = 1;
  prVar3 = &(this->_rationalPosInfty).m_backend.m_value;
  (prVar3->num).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_sign = false;
  (prVar3->num).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_internal = true;
  (this->_rationalPosInfty).m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_alias = false;
  (this->_rationalPosInfty).m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_data.la[0] = 1;
  (this->_rationalPosInfty).m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_limbs = 1;
  prVar3 = &(this->_rationalPosInfty).m_backend.m_value;
  (prVar3->den).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_sign = false;
  (prVar3->den).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_internal = true;
  (this->_rationalPosInfty).m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_alias = false;
  (this->_rationalNegInfty).m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_data.la[0] = 0;
  (this->_rationalNegInfty).m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_limbs = 1;
  prVar3 = &(this->_rationalNegInfty).m_backend.m_value;
  (prVar3->num).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_sign = false;
  (prVar3->num).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_internal = true;
  (this->_rationalNegInfty).m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_alias = false;
  (this->_rationalNegInfty).m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_data.la[0] = 1;
  (this->_rationalNegInfty).m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_limbs = 1;
  prVar3 = &(this->_rationalNegInfty).m_backend.m_value;
  (prVar3->den).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_sign = false;
  (prVar3->den).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_internal = true;
  (this->_rationalNegInfty).m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_alias = false;
  (this->_rationalFeastol).m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_data.la[0] = 0;
  (this->_rationalFeastol).m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_limbs = 1;
  prVar3 = &(this->_rationalFeastol).m_backend.m_value;
  (prVar3->num).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_sign = false;
  (prVar3->num).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_internal = true;
  (this->_rationalFeastol).m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_alias = false;
  (this->_rationalFeastol).m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_data.la[0] = 1;
  (this->_rationalFeastol).m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_limbs = 1;
  prVar3 = &(this->_rationalFeastol).m_backend.m_value;
  (prVar3->den).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_sign = false;
  (prVar3->den).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_internal = true;
  (this->_rationalFeastol).m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_alias = false;
  (this->_rationalOpttol).m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_data.la[0] = 0;
  (this->_rationalOpttol).m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_limbs = 1;
  prVar3 = &(this->_rationalOpttol).m_backend.m_value;
  (prVar3->num).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_sign = false;
  (prVar3->num).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_internal = true;
  (this->_rationalOpttol).m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_alias = false;
  (this->_rationalOpttol).m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_data.la[0] = 1;
  (this->_rationalOpttol).m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_limbs = 1;
  prVar3 = &(this->_rationalOpttol).m_backend.m_value;
  (prVar3->den).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_sign = false;
  (prVar3->den).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_internal = true;
  (this->_rationalOpttol).m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_alias = false;
  (this->_rationalMaxscaleincr).m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_data.la[0] = 0;
  (this->_rationalMaxscaleincr).m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_limbs = 1;
  prVar3 = &(this->_rationalMaxscaleincr).m_backend.m_value;
  (prVar3->num).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_sign = false;
  (prVar3->num).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_internal = true;
  (this->_rationalMaxscaleincr).m_backend.m_value.num.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_alias = false;
  (this->_rationalMaxscaleincr).m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_data.la[0] = 1;
  (this->_rationalMaxscaleincr).m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_limbs = 1;
  prVar3 = &(this->_rationalMaxscaleincr).m_backend.m_value;
  (prVar3->den).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_sign = false;
  (prVar3->den).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_internal = true;
  (this->_rationalMaxscaleincr).m_backend.m_value.den.m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_alias = false;
  this_00 = &this->_solver;
  SPxSolverBase<double>::SPxSolverBase(this_00,LEAVE,ROW,USER_TIME);
  SLUFactor<double>::SLUFactor(&this->_slufactor);
  local_360 = &this->_slufactor;
  SPxMainSM<double>::SPxMainSM(&this->_simplifierMainSM,USER_TIME);
  local_250 = &this->_simplifierMainSM;
  SPxSimplifier<double>::SPxSimplifier
            (&(this->_simplifierPaPILO).super_SPxSimplifier<double>,"PaPILO",USER_TIME);
  (this->_simplifierPaPILO).super_SPxSimplifier<double>._vptr_SPxSimplifier =
       (_func_int **)&PTR__Presol_0069f210;
  (this->_scalerUniequi).super_SPxScaler<double>.m_name = "uni-Equilibrium";
  (this->_scalerUniequi).super_SPxScaler<double>.spxout = (SPxOut *)0x0;
  (this->_scalerUniequi).super_SPxScaler<double>._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->_scalerUniequi).super_SPxScaler<double>._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_scalerUniequi).super_SPxScaler<double>.m_activeColscaleExp = (DataArray<int> *)0x0;
  (this->_scalerUniequi).super_SPxScaler<double>.m_activeRowscaleExp = (DataArray<int> *)0x0;
  (this->_scalerUniequi).super_SPxScaler<double>.m_colFirst = false;
  (this->_scalerUniequi).super_SPxScaler<double>.m_doBoth = false;
  (this->_scalerUniequi).super_SPxScaler<double>._vptr_SPxScaler = (_func_int **)&PTR_setup_0069f2e0
  ;
  (this->_scalerBiequi).super_SPxScaler<double>.m_name = "bi-Equilibrium";
  (this->_scalerBiequi).super_SPxScaler<double>.m_activeColscaleExp = (DataArray<int> *)0x0;
  (this->_scalerBiequi).super_SPxScaler<double>.m_activeRowscaleExp = (DataArray<int> *)0x0;
  (this->_scalerBiequi).super_SPxScaler<double>.m_colFirst = false;
  (this->_scalerBiequi).super_SPxScaler<double>.m_doBoth = true;
  (this->_scalerBiequi).super_SPxScaler<double>.spxout = (SPxOut *)0x0;
  (this->_scalerBiequi).super_SPxScaler<double>._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->_scalerBiequi).super_SPxScaler<double>._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_scalerBiequi).super_SPxScaler<double>._vptr_SPxScaler = (_func_int **)&PTR_setup_0069f2e0;
  (this->_scalerGeo1).super_SPxScaler<double>.m_name = "Geometric";
  (this->_scalerGeo1).super_SPxScaler<double>.m_activeColscaleExp = (DataArray<int> *)0x0;
  (this->_scalerGeo1).super_SPxScaler<double>.m_activeRowscaleExp = (DataArray<int> *)0x0;
  (this->_scalerGeo1).super_SPxScaler<double>.m_colFirst = false;
  (this->_scalerGeo1).super_SPxScaler<double>.m_doBoth = true;
  (this->_scalerGeo1).super_SPxScaler<double>.spxout = (SPxOut *)0x0;
  (this->_scalerGeo1).super_SPxScaler<double>._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->_scalerGeo1).super_SPxScaler<double>._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_scalerGeo1).super_SPxScaler<double>._vptr_SPxScaler = (_func_int **)&PTR_setup_0069f688;
  (this->_scalerGeo1).postequilibration = false;
  (this->_scalerGeo1).m_maxIterations = 1;
  (this->_scalerGeo1).m_minImprovement = 0.85;
  (this->_scalerGeo1).m_goodEnoughRatio = 1000.0;
  (this->_scalerGeo8).super_SPxScaler<double>.m_name = "Geometric";
  (this->_scalerGeo8).super_SPxScaler<double>.m_activeColscaleExp = (DataArray<int> *)0x0;
  (this->_scalerGeo8).super_SPxScaler<double>.m_activeRowscaleExp = (DataArray<int> *)0x0;
  (this->_scalerGeo8).super_SPxScaler<double>.m_colFirst = false;
  (this->_scalerGeo8).super_SPxScaler<double>.m_doBoth = true;
  (this->_scalerGeo8).super_SPxScaler<double>._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_scalerGeo8).super_SPxScaler<double>.spxout = (SPxOut *)0x0;
  (this->_scalerGeo8).super_SPxScaler<double>._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->_scalerGeo8).super_SPxScaler<double>._vptr_SPxScaler = (_func_int **)&PTR_setup_0069f688;
  (this->_scalerGeo8).postequilibration = false;
  (this->_scalerGeo8).m_maxIterations = 8;
  (this->_scalerGeo8).m_minImprovement = 0.85;
  (this->_scalerGeo8).m_goodEnoughRatio = 1000.0;
  (this->_scalerGeoequi).super_SPxScaler<double>.m_name = "Geometric";
  (this->_scalerGeoequi).super_SPxScaler<double>.m_activeColscaleExp = (DataArray<int> *)0x0;
  (this->_scalerGeoequi).super_SPxScaler<double>.m_activeRowscaleExp = (DataArray<int> *)0x0;
  (this->_scalerGeoequi).super_SPxScaler<double>.m_colFirst = false;
  (this->_scalerGeoequi).super_SPxScaler<double>.m_doBoth = true;
  (this->_scalerGeoequi).super_SPxScaler<double>._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_scalerGeoequi).super_SPxScaler<double>.spxout = (SPxOut *)0x0;
  (this->_scalerGeoequi).super_SPxScaler<double>._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->_scalerGeoequi).super_SPxScaler<double>._vptr_SPxScaler = (_func_int **)&PTR_setup_0069f688
  ;
  (this->_scalerGeoequi).postequilibration = true;
  (this->_scalerGeoequi).m_maxIterations = 8;
  (this->_scalerGeoequi).m_minImprovement = 0.85;
  (this->_scalerGeoequi).m_goodEnoughRatio = 1000.0;
  (this->_scalerLeastsq).super_SPxScaler<double>.m_name = "Least squares";
  (this->_scalerLeastsq).super_SPxScaler<double>.m_colFirst = false;
  (this->_scalerLeastsq).super_SPxScaler<double>.m_doBoth = false;
  (this->_scalerLeastsq).super_SPxScaler<double>.m_activeColscaleExp = (DataArray<int> *)0x0;
  (this->_scalerLeastsq).super_SPxScaler<double>.m_activeRowscaleExp = (DataArray<int> *)0x0;
  (this->_scalerLeastsq).super_SPxScaler<double>._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_scalerLeastsq).super_SPxScaler<double>.spxout = (SPxOut *)0x0;
  (this->_scalerLeastsq).super_SPxScaler<double>._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->_scalerLeastsq).super_SPxScaler<double>._vptr_SPxScaler = (_func_int **)&PTR_setup_0069f860
  ;
  (this->_scalerLeastsq).acrcydivisor = 1000.0;
  (this->_scalerLeastsq).maxrounds = 0x14;
  local_260 = &this->_starterWeight;
  local_258 = &this->_simplifierPaPILO;
  SPxWeightST<double>::SPxWeightST(local_260);
  local_268 = &this->_starterSum;
  SPxWeightST<double>::SPxWeightST((SPxWeightST<double> *)local_268);
  (this->_starterSum).super_SPxVectorST<double>.state = NONE;
  (this->_starterSum).super_SPxVectorST<double>.vec.val.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  *(pointer *)
   ((long)&(this->_starterSum).super_SPxVectorST<double>.vec.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data + 8)
       = (pointer)0x0;
  *(pointer *)
   ((long)&(this->_starterSum).super_SPxVectorST<double>.vec.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data +
   0x10) = (pointer)0x0;
  (this->_starterSum).super_SPxVectorST<double>.super_SPxWeightST<double>.super_SPxStarter<double>.
  _vptr_SPxStarter = (_func_int **)&PTR__SPxVectorST_0069fb08;
  (this->_starterSum).super_SPxVectorST<double>.super_SPxWeightST<double>.super_SPxStarter<double>.
  m_name = "Sum";
  local_270 = &this->_starterVector;
  SPxWeightST<double>::SPxWeightST(&local_270->super_SPxWeightST<double>);
  (this->_starterVector).super_SPxWeightST<double>.super_SPxStarter<double>._vptr_SPxStarter =
       (_func_int **)&PTR__SPxVectorST_0069fb90;
  (this->_starterVector).state = NONE;
  (this->_starterVector).vec.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_starterVector).vec.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_starterVector).vec.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_starterVector).super_SPxWeightST<double>.super_SPxStarter<double>.m_name = "vector";
  local_278 = &this->_pricerAuto;
  SPxAutoPR<double>::SPxAutoPR(local_278);
  (this->_pricerDantzig).super_SPxPricer<double>.m_name = "Dantzig";
  (this->_pricerDantzig).super_SPxPricer<double>.thesolver = (SPxSolverBase<double> *)0x0;
  (this->_pricerDantzig).super_SPxPricer<double>.thetolerance = 0.0;
  (this->_pricerDantzig).super_SPxPricer<double>._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->_pricerDantzig).super_SPxPricer<double>._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_pricerDantzig).super_SPxPricer<double>.compare.elements = (IdxElement *)0x0;
  (this->_pricerDantzig).super_SPxPricer<double>._vptr_SPxPricer =
       (_func_int **)&PTR_getName_006a0040;
  local_280 = &this->_pricerParMult;
  SPxParMultPR<double>::SPxParMultPR(local_280);
  local_288 = &this->_pricerDevex;
  SPxDevexPR<double>::SPxDevexPR(local_288);
  local_290 = &this->_pricerQuickSteep;
  SPxSteepPR<double>::SPxSteepPR(local_290,"Steep",DEFAULT);
  local_298 = &this->_pricerSteep;
  SPxSteepPR<double>::SPxSteepPR(&local_298->super_SPxSteepPR<double>,"SteepEx",EXACT);
  (this->_pricerSteep).super_SPxSteepPR<double>.super_SPxPricer<double>._vptr_SPxPricer =
       (_func_int **)&PTR_getName_0069fe80;
  (this->_ratiotesterTextbook).super_SPxRatioTester<double>.thesolver = (SPxSolverBase<double> *)0x0
  ;
  (this->_ratiotesterTextbook).super_SPxRatioTester<double>.m_name = "Default";
  (this->_ratiotesterTextbook).super_SPxRatioTester<double>.m_type = LEAVE;
  (this->_ratiotesterTextbook).super_SPxRatioTester<double>.delta = 1e-06;
  (this->_ratiotesterTextbook).super_SPxRatioTester<double>._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->_ratiotesterTextbook).super_SPxRatioTester<double>._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_ratiotesterTextbook).super_SPxRatioTester<double>._vptr_SPxRatioTester =
       (_func_int **)&PTR_getName_006a0200;
  (this->_ratiotesterHarris).super_SPxRatioTester<double>.thesolver = (SPxSolverBase<double> *)0x0;
  (this->_ratiotesterHarris).super_SPxRatioTester<double>.m_name = "Harris";
  (this->_ratiotesterHarris).super_SPxRatioTester<double>.m_type = LEAVE;
  (this->_ratiotesterHarris).super_SPxRatioTester<double>.delta = 1e-06;
  (this->_ratiotesterHarris).super_SPxRatioTester<double>._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->_ratiotesterHarris).super_SPxRatioTester<double>._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_ratiotesterHarris).super_SPxRatioTester<double>._vptr_SPxRatioTester =
       (_func_int **)&PTR_getName_006a0318;
  (this->_ratiotesterFast).super_SPxRatioTester<double>.thesolver = (SPxSolverBase<double> *)0x0;
  (this->_ratiotesterFast).super_SPxRatioTester<double>.m_name = "Fast";
  (this->_ratiotesterFast).super_SPxRatioTester<double>.m_type = LEAVE;
  (this->_ratiotesterFast).super_SPxRatioTester<double>.delta = 1e-06;
  (this->_ratiotesterFast).super_SPxRatioTester<double>._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->_ratiotesterFast).super_SPxRatioTester<double>._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_ratiotesterFast).super_SPxRatioTester<double>._vptr_SPxRatioTester =
       (_func_int **)&PTR_getName_006a03a8;
  (this->_ratiotesterFast).minStab = 1e-06;
  (this->_ratiotesterFast).epsilon = 1e-16;
  (this->_ratiotesterFast).fastDelta = 1e-06;
  (this->_ratiotesterFast).iscoid = false;
  local_368 = &this->_ratiotesterBoundFlipping;
  SPxBoundFlippingRT<double>::SPxBoundFlippingRT(local_368);
  local_370 = &this->_boostedSolver;
  this->_simplifier = (SPxSimplifier<double> *)0x0;
  this->_scaler = (SPxScaler<double> *)0x0;
  this->_starter = (SPxStarter<double> *)0x0;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxSolverBase(local_370,LEAVE,ROW,USER_TIME);
  this->_initialPrecision = 0x32;
  this->_tolPrecisionRatio = 0.65;
  this->_epsZeroPrecisionRatio = 1.0;
  this->_epsFactorPrecisionRatio = 1.25;
  this->_epsUpdatePrecisionRatio = 1.0;
  this->_epsPivotPrecisionRatio = 0.625;
  local_378 = &this->_boostedSlufactor;
  SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SLUFactor(local_378);
  local_2a0 = &this->_boostedPricerAuto;
  SPxAutoPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxAutoPR(local_2a0);
  SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxDantzigPR(&this->_boostedPricerDantzig);
  local_2a8 = &this->_boostedPricerParMult;
  SPxParMultPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxParMultPR(local_2a8);
  local_2b0 = &this->_boostedPricerDevex;
  SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxDevexPR(local_2b0);
  local_2b8 = &this->_boostedPricerQuickSteep;
  SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxSteepPR(local_2b8,"Steep",DEFAULT);
  local_2c0 = &this->_boostedPricerSteep;
  SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxSteepPR(&local_2c0->
                super_SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,"SteepEx",EXACT);
  (this->_boostedPricerSteep).
  super_SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .
  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._vptr_SPxPricer = (_func_int **)&PTR_getName_006a1390;
  (this->_boostedRatiotesterTextbook).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._vptr_SPxRatioTester = (_func_int **)&PTR_getName_006a17b0;
  (this->_boostedRatiotesterTextbook).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .thesolver = (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x0;
  (this->_boostedRatiotesterTextbook).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_name = "Default";
  (this->_boostedRatiotesterTextbook).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_type = LEAVE;
  (this->_boostedRatiotesterTextbook).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .delta.m_backend.fpclass = cpp_dec_float_finite;
  (this->_boostedRatiotesterTextbook).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .delta.m_backend.prec_elem = 10;
  pnVar1 = &(this->_boostedRatiotesterTextbook).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .delta;
  (pnVar1->m_backend).data._M_elems[0] = 0;
  (pnVar1->m_backend).data._M_elems[1] = 0;
  pcVar4 = &(this->_boostedRatiotesterTextbook).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .delta.m_backend;
  (pcVar4->data)._M_elems[2] = 0;
  (pcVar4->data)._M_elems[3] = 0;
  pcVar4 = &(this->_boostedRatiotesterTextbook).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .delta.m_backend;
  (pcVar4->data)._M_elems[4] = 0;
  (pcVar4->data)._M_elems[5] = 0;
  pcVar4 = &(this->_boostedRatiotesterTextbook).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .delta.m_backend;
  (pcVar4->data)._M_elems[6] = 0;
  (pcVar4->data)._M_elems[7] = 0;
  *(undefined8 *)
   ((long)(this->_boostedRatiotesterTextbook).
          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .delta.m_backend.data._M_elems + 0x1d) = 0;
  *(undefined8 *)
   ((long)(this->_boostedRatiotesterTextbook).
          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .delta.m_backend.data._M_elems + 0x25) = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)
             &(this->_boostedRatiotesterTextbook).
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .delta,1e-06);
  (this->_boostedRatiotesterTextbook).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_boostedRatiotesterTextbook).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_boostedRatiotesterTextbook).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._vptr_SPxRatioTester = (_func_int **)&PTR_getName_006a1710;
  (this->_boostedRatiotesterHarris).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._vptr_SPxRatioTester = (_func_int **)&PTR_getName_006a17b0;
  (this->_boostedRatiotesterHarris).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .thesolver = (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x0;
  (this->_boostedRatiotesterHarris).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_name = "Harris";
  (this->_boostedRatiotesterHarris).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_type = LEAVE;
  (this->_boostedRatiotesterHarris).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .delta.m_backend.fpclass = cpp_dec_float_finite;
  (this->_boostedRatiotesterHarris).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .delta.m_backend.prec_elem = 10;
  pnVar1 = &(this->_boostedRatiotesterHarris).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .delta;
  (pnVar1->m_backend).data._M_elems[0] = 0;
  (pnVar1->m_backend).data._M_elems[1] = 0;
  pcVar4 = &(this->_boostedRatiotesterHarris).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .delta.m_backend;
  (pcVar4->data)._M_elems[2] = 0;
  (pcVar4->data)._M_elems[3] = 0;
  pcVar4 = &(this->_boostedRatiotesterHarris).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .delta.m_backend;
  (pcVar4->data)._M_elems[4] = 0;
  (pcVar4->data)._M_elems[5] = 0;
  pcVar4 = &(this->_boostedRatiotesterHarris).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .delta.m_backend;
  (pcVar4->data)._M_elems[6] = 0;
  (pcVar4->data)._M_elems[7] = 0;
  *(undefined8 *)
   ((long)(this->_boostedRatiotesterHarris).
          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .delta.m_backend.data._M_elems + 0x1d) = 0;
  *(undefined8 *)
   ((long)(this->_boostedRatiotesterHarris).
          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .delta.m_backend.data._M_elems + 0x25) = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)
             &(this->_boostedRatiotesterHarris).
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .delta,1e-06);
  (this->_boostedRatiotesterHarris).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_boostedRatiotesterHarris).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_boostedRatiotesterHarris).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._vptr_SPxRatioTester = (_func_int **)&PTR_getName_006a1828;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxFastRT(&this->_boostedRatiotesterFast);
  this_01 = &this->_boostedRatiotesterBoundFlipping;
  SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxBoundFlippingRT(this_01);
  (this->_boostedScalerUniequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_name = "bi-Equilibrium";
  (this->_boostedScalerUniequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_activeColscaleExp = (DataArray<int> *)0x0;
  (this->_boostedScalerUniequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_activeRowscaleExp = (DataArray<int> *)0x0;
  (this->_boostedScalerUniequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_colFirst = false;
  (this->_boostedScalerUniequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_doBoth = true;
  (this->_boostedScalerUniequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .spxout = (SPxOut *)0x0;
  (this->_boostedScalerUniequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_boostedScalerUniequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_boostedScalerUniequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._vptr_SPxScaler = (_func_int **)&PTR_setup_006a19d8;
  (this->_boostedScalerBiequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_name = "bi-Equilibrium";
  (this->_boostedScalerBiequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_activeColscaleExp = (DataArray<int> *)0x0;
  (this->_boostedScalerBiequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_activeRowscaleExp = (DataArray<int> *)0x0;
  (this->_boostedScalerBiequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_colFirst = false;
  (this->_boostedScalerBiequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_doBoth = true;
  (this->_boostedScalerBiequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .spxout = (SPxOut *)0x0;
  (this->_boostedScalerBiequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_boostedScalerBiequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_boostedScalerBiequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._vptr_SPxScaler = (_func_int **)&PTR_setup_006a19d8;
  local_38 = 0xa00000000;
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  uStack_50 = 0;
  uStack_4b = 0;
  local_48 = 0;
  uStack_43 = 0;
  local_40 = 0;
  local_3c = false;
  local_2c8 = this_01;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_68,0.85);
  local_78 = 0xa00000000;
  local_a8 = 0;
  uStack_a0 = 0;
  local_98 = 0;
  uStack_90 = 0;
  uStack_8b = 0;
  local_88 = 0;
  uStack_83 = 0;
  local_80 = 0;
  local_7c = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_a8,1000.0);
  (this->_boostedScalerGeo1).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_name = "Geometric";
  (this->_boostedScalerGeo1).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_activeColscaleExp = (DataArray<int> *)0x0;
  (this->_boostedScalerGeo1).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_activeRowscaleExp = (DataArray<int> *)0x0;
  (this->_boostedScalerGeo1).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_colFirst = false;
  (this->_boostedScalerGeo1).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_doBoth = true;
  (this->_boostedScalerGeo1).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .spxout = (SPxOut *)0x0;
  (this->_boostedScalerGeo1).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_boostedScalerGeo1).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_boostedScalerGeo1).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._vptr_SPxScaler = (_func_int **)&PTR_setup_006a1d80;
  (this->_boostedScalerGeo1).postequilibration = false;
  (this->_boostedScalerGeo1).m_maxIterations = 8;
  *(undefined8 *)(this->_boostedScalerGeo1).m_minImprovement.m_backend.data._M_elems = local_68;
  *(undefined8 *)((this->_boostedScalerGeo1).m_minImprovement.m_backend.data._M_elems + 2) =
       uStack_60;
  *(undefined8 *)((this->_boostedScalerGeo1).m_minImprovement.m_backend.data._M_elems + 4) =
       local_58;
  *(ulong *)((this->_boostedScalerGeo1).m_minImprovement.m_backend.data._M_elems + 6) =
       CONCAT35(uStack_4b,uStack_50);
  *(ulong *)((this->_boostedScalerGeo1).m_minImprovement.m_backend.data._M_elems + 8) =
       CONCAT35(uStack_43,local_48);
  (this->_boostedScalerGeo1).m_minImprovement.m_backend.exp = local_40;
  (this->_boostedScalerGeo1).m_minImprovement.m_backend.neg = local_3c;
  (this->_boostedScalerGeo1).m_minImprovement.m_backend.fpclass = (undefined4)local_38;
  (this->_boostedScalerGeo1).m_minImprovement.m_backend.prec_elem = local_38._4_4_;
  *(undefined8 *)(this->_boostedScalerGeo1).m_goodEnoughRatio.m_backend.data._M_elems = local_a8;
  *(undefined8 *)((this->_boostedScalerGeo1).m_goodEnoughRatio.m_backend.data._M_elems + 2) =
       uStack_a0;
  *(undefined8 *)((this->_boostedScalerGeo1).m_goodEnoughRatio.m_backend.data._M_elems + 4) =
       local_98;
  *(ulong *)((this->_boostedScalerGeo1).m_goodEnoughRatio.m_backend.data._M_elems + 6) =
       CONCAT35(uStack_8b,uStack_90);
  *(ulong *)((this->_boostedScalerGeo1).m_goodEnoughRatio.m_backend.data._M_elems + 8) =
       CONCAT35(uStack_83,local_88);
  (this->_boostedScalerGeo1).m_goodEnoughRatio.m_backend.exp = local_80;
  (this->_boostedScalerGeo1).m_goodEnoughRatio.m_backend.neg = local_7c;
  (this->_boostedScalerGeo1).m_goodEnoughRatio.m_backend.fpclass = (undefined4)local_78;
  (this->_boostedScalerGeo1).m_goodEnoughRatio.m_backend.prec_elem = local_78._4_4_;
  local_b8 = 0xa00000000;
  local_e8 = 0;
  uStack_e0 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  uStack_cb = 0;
  local_c8 = 0;
  uStack_c3 = 0;
  local_c0 = 0;
  local_bc = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_e8,0.85);
  local_f8 = 0xa00000000;
  local_128 = 0;
  uStack_120 = 0;
  local_118 = 0;
  uStack_110 = 0;
  uStack_10b = 0;
  local_108 = 0;
  uStack_103 = 0;
  local_100 = 0;
  local_fc = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_128,1000.0);
  (this->_boostedScalerGeo8).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_name = "Geometric";
  (this->_boostedScalerGeo8).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_activeColscaleExp = (DataArray<int> *)0x0;
  (this->_boostedScalerGeo8).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_activeRowscaleExp = (DataArray<int> *)0x0;
  (this->_boostedScalerGeo8).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_colFirst = false;
  (this->_boostedScalerGeo8).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_doBoth = true;
  (this->_boostedScalerGeo8).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .spxout = (SPxOut *)0x0;
  (this->_boostedScalerGeo8).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_boostedScalerGeo8).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_boostedScalerGeo8).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._vptr_SPxScaler = (_func_int **)&PTR_setup_006a1d80;
  (this->_boostedScalerGeo8).postequilibration = false;
  (this->_boostedScalerGeo8).m_maxIterations = 8;
  *(undefined8 *)(this->_boostedScalerGeo8).m_minImprovement.m_backend.data._M_elems = local_e8;
  *(undefined8 *)((this->_boostedScalerGeo8).m_minImprovement.m_backend.data._M_elems + 2) =
       uStack_e0;
  *(undefined8 *)((this->_boostedScalerGeo8).m_minImprovement.m_backend.data._M_elems + 4) =
       local_d8;
  *(ulong *)((this->_boostedScalerGeo8).m_minImprovement.m_backend.data._M_elems + 6) =
       CONCAT35(uStack_cb,uStack_d0);
  *(ulong *)((this->_boostedScalerGeo8).m_minImprovement.m_backend.data._M_elems + 8) =
       CONCAT35(uStack_c3,local_c8);
  (this->_boostedScalerGeo8).m_minImprovement.m_backend.exp = local_c0;
  (this->_boostedScalerGeo8).m_minImprovement.m_backend.neg = local_bc;
  (this->_boostedScalerGeo8).m_minImprovement.m_backend.fpclass = (undefined4)local_b8;
  (this->_boostedScalerGeo8).m_minImprovement.m_backend.prec_elem = local_b8._4_4_;
  *(undefined8 *)(this->_boostedScalerGeo8).m_goodEnoughRatio.m_backend.data._M_elems = local_128;
  *(undefined8 *)((this->_boostedScalerGeo8).m_goodEnoughRatio.m_backend.data._M_elems + 2) =
       uStack_120;
  *(undefined8 *)((this->_boostedScalerGeo8).m_goodEnoughRatio.m_backend.data._M_elems + 4) =
       local_118;
  *(ulong *)((this->_boostedScalerGeo8).m_goodEnoughRatio.m_backend.data._M_elems + 6) =
       CONCAT35(uStack_10b,uStack_110);
  *(ulong *)((this->_boostedScalerGeo8).m_goodEnoughRatio.m_backend.data._M_elems + 8) =
       CONCAT35(uStack_103,local_108);
  (this->_boostedScalerGeo8).m_goodEnoughRatio.m_backend.exp = local_100;
  (this->_boostedScalerGeo8).m_goodEnoughRatio.m_backend.neg = local_fc;
  (this->_boostedScalerGeo8).m_goodEnoughRatio.m_backend.fpclass = (undefined4)local_f8;
  (this->_boostedScalerGeo8).m_goodEnoughRatio.m_backend.prec_elem = local_f8._4_4_;
  local_138 = 0xa00000000;
  local_168 = 0;
  uStack_160 = 0;
  local_158 = 0;
  uStack_150 = 0;
  uStack_14b = 0;
  local_148 = 0;
  uStack_143 = 0;
  local_140 = 0;
  local_13c = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_168,0.85);
  local_178 = 0xa00000000;
  local_1a8 = 0;
  uStack_1a0 = 0;
  local_198 = 0;
  uStack_190 = 0;
  uStack_18b = 0;
  local_188 = 0;
  uStack_183 = 0;
  local_180 = 0;
  local_17c = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_1a8,1000.0);
  (this->_boostedScalerGeoequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_name = "Geometric";
  (this->_boostedScalerGeoequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_activeColscaleExp = (DataArray<int> *)0x0;
  (this->_boostedScalerGeoequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_activeRowscaleExp = (DataArray<int> *)0x0;
  (this->_boostedScalerGeoequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_colFirst = false;
  (this->_boostedScalerGeoequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_doBoth = true;
  (this->_boostedScalerGeoequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .spxout = (SPxOut *)0x0;
  (this->_boostedScalerGeoequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_boostedScalerGeoequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_boostedScalerGeoequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._vptr_SPxScaler = (_func_int **)&PTR_setup_006a1d80;
  (this->_boostedScalerGeoequi).postequilibration = false;
  (this->_boostedScalerGeoequi).m_maxIterations = 8;
  *(undefined8 *)(this->_boostedScalerGeoequi).m_minImprovement.m_backend.data._M_elems = local_168;
  *(undefined8 *)((this->_boostedScalerGeoequi).m_minImprovement.m_backend.data._M_elems + 2) =
       uStack_160;
  *(undefined8 *)((this->_boostedScalerGeoequi).m_minImprovement.m_backend.data._M_elems + 4) =
       local_158;
  *(ulong *)((this->_boostedScalerGeoequi).m_minImprovement.m_backend.data._M_elems + 6) =
       CONCAT35(uStack_14b,uStack_150);
  *(ulong *)((this->_boostedScalerGeoequi).m_minImprovement.m_backend.data._M_elems + 8) =
       CONCAT35(uStack_143,local_148);
  (this->_boostedScalerGeoequi).m_minImprovement.m_backend.exp = local_140;
  (this->_boostedScalerGeoequi).m_minImprovement.m_backend.neg = local_13c;
  (this->_boostedScalerGeoequi).m_minImprovement.m_backend.fpclass = (undefined4)local_138;
  (this->_boostedScalerGeoequi).m_minImprovement.m_backend.prec_elem = local_138._4_4_;
  *(undefined8 *)(this->_boostedScalerGeoequi).m_goodEnoughRatio.m_backend.data._M_elems = local_1a8
  ;
  *(undefined8 *)((this->_boostedScalerGeoequi).m_goodEnoughRatio.m_backend.data._M_elems + 2) =
       uStack_1a0;
  *(undefined8 *)((this->_boostedScalerGeoequi).m_goodEnoughRatio.m_backend.data._M_elems + 4) =
       local_198;
  *(ulong *)((this->_boostedScalerGeoequi).m_goodEnoughRatio.m_backend.data._M_elems + 6) =
       CONCAT35(uStack_18b,uStack_190);
  *(ulong *)((this->_boostedScalerGeoequi).m_goodEnoughRatio.m_backend.data._M_elems + 8) =
       CONCAT35(uStack_183,local_188);
  (this->_boostedScalerGeoequi).m_goodEnoughRatio.m_backend.exp = local_180;
  (this->_boostedScalerGeoequi).m_goodEnoughRatio.m_backend.neg = local_17c;
  (this->_boostedScalerGeoequi).m_goodEnoughRatio.m_backend.fpclass = (undefined4)local_178;
  (this->_boostedScalerGeoequi).m_goodEnoughRatio.m_backend.prec_elem = local_178._4_4_;
  SPxLeastSqSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxLeastSqSC(&this->_boostedScalerLeastsq);
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxMainSM(&this->_boostedSimplifierMainSM,USER_TIME);
  local_2d0 = &this->_boostedSimplifierMainSM;
  SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::SPxSimplifier(&(this->_boostedSimplifierPaPILO).
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ,"PaPILO",USER_TIME);
  (this->_boostedSimplifierPaPILO).
  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._vptr_SPxSimplifier = (_func_int **)&PTR__Presol_006a2ea8;
  (this->_manualLower).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_manualLower).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_manualLower).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_manualUpper).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_manualUpper).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_manualUpper).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_manualLhs).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_manualLhs).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_manualLhs).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_manualRhs).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_manualRhs).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_manualRhs).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_manualObj).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_manualObj).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_manualObj).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d8 = &this->_boostedSimplifierPaPILO;
  SPxLPBase<double>::SPxLPBase(&this->_manualRealLP);
  this->_rationalLP = (SPxLPRational *)0x0;
  local_2e8 = &this->_rationalLUSolver;
  local_2e0 = &this->_manualRealLP;
  SLUFactorRational::SLUFactorRational(local_2e8);
  local_380 = &(this->_rationalLUSolverBind).data;
  (this->_rationalLUSolverBind).data = (int *)0x0;
  (this->_rationalLUSolverBind).memFactor = 1.2;
  (this->_rationalLUSolverBind).thesize = 0;
  (this->_rationalLUSolverBind).themax = 1;
  spx_alloc<int*>(local_380,1);
  local_2f0 = &this->_slackCols;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::LPColSetBase(local_2f0,-1,-1);
  local_2f8 = &this->_tauColVector;
  (this->_tauColVector).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
             *)0x0;
  (this->_tauColVector).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  .memsize = 0;
  (this->_tauColVector).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  .memused = 0;
  (this->_unboundedLower).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_unboundedLower).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_unboundedLower).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_unboundedUpper).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_unboundedUpper).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_unboundedUpper).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_unboundedLhs).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_unboundedLhs).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_unboundedLhs).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_unboundedRhs).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_unboundedRhs).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_unboundedRhs).val.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_tauColVector)._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_0069d4a0;
  (this->_tauColVector).theelem =
       (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        *)0x0;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::allocMem(local_2f8,8);
  local_300 = &this->_feasObj;
  (this->_primalDualDiff).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
             *)0x0;
  (this->_primalDualDiff).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  .memsize = 0;
  (this->_primalDualDiff).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  .memused = 0;
  memset(local_300,0,0xf0);
  (this->_primalDualDiff)._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_0069d4a0;
  (this->_primalDualDiff).theelem =
       (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        *)0x0;
  local_308 = &this->_primalDualDiff;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::allocMem(&this->_primalDualDiff,8);
  (this->_storedBasisStatusRows).data = (VarStatus *)0x0;
  (this->_storedBasisStatusRows).memFactor = 1.2;
  (this->_storedBasisStatusRows).thesize = 0;
  (this->_storedBasisStatusRows).themax = 1;
  spx_alloc<soplex::SPxSolverBase<double>::VarStatus*>(&(this->_storedBasisStatusRows).data,1);
  (this->_storedBasisStatusCols).data = (VarStatus *)0x0;
  (this->_storedBasisStatusCols).memFactor = 1.2;
  (this->_storedBasisStatusCols).thesize = 0;
  (this->_storedBasisStatusCols).themax = 1;
  spx_alloc<soplex::SPxSolverBase<double>::VarStatus*>(&(this->_storedBasisStatusCols).data,1);
  Array<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_*>
  ::Array(&this->_unitMatrixRational,0);
  pSVar5 = local_358;
  (this->_colTypes).data = (RangeType *)0x0;
  (this->_colTypes).memFactor = 1.2;
  (this->_colTypes).thesize = 0;
  (this->_colTypes).themax = 1;
  local_310 = &this->_unitMatrixRational;
  spx_alloc<soplex::SoPlexBase<double>::RangeType*>(&(this->_colTypes).data,1);
  (this->_rowTypes).data = (RangeType *)0x0;
  (this->_rowTypes).memFactor = 1.2;
  (this->_rowTypes).thesize = 0;
  (this->_rowTypes).themax = 1;
  spx_alloc<soplex::SoPlexBase<double>::RangeType*>(&(this->_rowTypes).data,1);
  this->_status = UNKNOWN;
  local_388 = &(this->_basisStatusRows).data;
  (this->_basisStatusRows).data = (VarStatus *)0x0;
  (this->_basisStatusRows).memFactor = 1.2;
  (this->_basisStatusRows).thesize = 0;
  (this->_basisStatusRows).themax = 1;
  spx_alloc<soplex::SPxSolverBase<double>::VarStatus*>(local_388,1);
  local_390 = &(this->_basisStatusCols).data;
  (this->_basisStatusCols).data = (VarStatus *)0x0;
  (this->_basisStatusCols).memFactor = 1.2;
  (this->_basisStatusCols).thesize = 0;
  (this->_basisStatusCols).themax = 1;
  spx_alloc<soplex::SPxSolverBase<double>::VarStatus*>(local_390,1);
  local_398 = &(this->_oldBasisStatusRows).data;
  (this->_oldBasisStatusRows).data = (VarStatus *)0x0;
  (this->_oldBasisStatusRows).memFactor = 1.2;
  (this->_oldBasisStatusRows).thesize = 0;
  (this->_oldBasisStatusRows).themax = 1;
  spx_alloc<soplex::SPxSolverBase<double>::VarStatus*>(local_398,1);
  local_3a0 = &(this->_oldBasisStatusCols).data;
  (this->_oldBasisStatusCols).data = (VarStatus *)0x0;
  (this->_oldBasisStatusCols).memFactor = 1.2;
  (this->_oldBasisStatusCols).thesize = 0;
  (this->_oldBasisStatusCols).themax = 1;
  spx_alloc<soplex::SPxSolverBase<double>::VarStatus*>(local_3a0,1);
  local_3a8 = &(this->_oldFeasBasisStatusRows).data;
  (this->_oldFeasBasisStatusRows).data = (VarStatus *)0x0;
  (this->_oldFeasBasisStatusRows).memFactor = 1.2;
  (this->_oldFeasBasisStatusRows).thesize = 0;
  (this->_oldFeasBasisStatusRows).themax = 1;
  spx_alloc<soplex::SPxSolverBase<double>::VarStatus*>(local_3a8,1);
  local_3b0 = &(this->_oldFeasBasisStatusCols).data;
  (this->_oldFeasBasisStatusCols).data = (VarStatus *)0x0;
  (this->_oldFeasBasisStatusCols).memFactor = 1.2;
  (this->_oldFeasBasisStatusCols).thesize = 0;
  (this->_oldFeasBasisStatusCols).themax = 1;
  spx_alloc<soplex::SPxSolverBase<double>::VarStatus*>(local_3b0,1);
  local_3b8 = &(this->_oldUnbdBasisStatusRows).data;
  (this->_oldUnbdBasisStatusRows).data = (VarStatus *)0x0;
  (this->_oldUnbdBasisStatusRows).memFactor = 1.2;
  (this->_oldUnbdBasisStatusRows).thesize = 0;
  (this->_oldUnbdBasisStatusRows).themax = 1;
  spx_alloc<soplex::SPxSolverBase<double>::VarStatus*>(local_3b8,1);
  local_3c0 = &(this->_oldUnbdBasisStatusCols).data;
  (this->_oldUnbdBasisStatusCols).data = (VarStatus *)0x0;
  (this->_oldUnbdBasisStatusCols).memFactor = 1.2;
  (this->_oldUnbdBasisStatusCols).thesize = 0;
  (this->_oldUnbdBasisStatusCols).themax = 1;
  spx_alloc<soplex::SPxSolverBase<double>::VarStatus*>(local_3c0,1);
  local_3c8 = &(this->_tmpBasisStatusRows).data;
  (this->_tmpBasisStatusRows).data = (VarStatus *)0x0;
  (this->_tmpBasisStatusRows).memFactor = 1.2;
  (this->_tmpBasisStatusRows).thesize = 0;
  (this->_tmpBasisStatusRows).themax = 1;
  spx_alloc<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::VarStatus*>
            (local_3c8,1);
  local_3d0 = &(this->_tmpBasisStatusCols).data;
  (this->_tmpBasisStatusCols).data = (VarStatus *)0x0;
  (this->_tmpBasisStatusCols).memFactor = 1.2;
  (this->_tmpBasisStatusCols).thesize = 0;
  (this->_tmpBasisStatusCols).themax = 1;
  spx_alloc<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::VarStatus*>
            (local_3d0,1);
  local_318 = &this->_solReal;
  memset(local_318,0,0x98);
  puVar2 = &(this->_solReal).field_0x98;
  *puVar2 = *puVar2 & 0xf0;
  SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::SolBase(&this->_solRational);
  local_320 = &this->_solRational;
  SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::SolBase(&this->_workSol);
  this->_hasBasis = false;
  this->_hasSolReal = false;
  this->_hasSolRational = false;
  local_330 = &this->_rationalPosone;
  local_350 = 1;
  local_328 = &this->_workSol;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor<long_long>(&local_330->m_backend,&local_350,(type *)0x0);
  local_338 = &this->_rationalNegone;
  local_350 = -1;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor<long_long>(&local_338->m_backend,&local_350,(type *)0x0);
  local_350 = 0;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor<long_long>(&(this->_rationalZero).m_backend,&local_350,(type *)0x0);
  local_3e0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
  (local_3e0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_3e0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_3e0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_006a2f78;
  local_3e0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_3e0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  local_3e0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)0x3c9cd2b297d889bc;
  local_3e0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_use_count = 0xc924223;
  local_3e0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_weak_count = 0x3bc79ca1;
  local_3e0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _vptr__Sp_counted_base = (_func_int **)0x3c9cd2b297d889bc;
  local_3e0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _M_use_count = -0x26284245;
  local_3e0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _M_weak_count = 0x3ddb7cdf;
  local_3e0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
  _vptr__Sp_counted_base = (_func_int **)0x3eb0c6f7a0b5ed8d;
  local_3e0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
  _M_use_count = -0x5f4a1273;
  local_3e0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
  _M_weak_count = 0x3eb0c6f7;
  local_3e0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
  _vptr__Sp_counted_base = (_func_int **)0x3eb0c6f7a0b5ed8d;
  local_3e0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
  _M_use_count = -0x5f4a1273;
  local_3e0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[4].
  _M_weak_count = 0x3eb0c6f7;
  local_3e0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[5].
  _vptr__Sp_counted_base = (_func_int **)0x3ff0000000000000;
  (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_3e0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_02 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = local_3e0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
    local_3e0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_3e0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_3e0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0019e069;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    (local_3e0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ->_M_use_count =
         (local_3e0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi)->_M_use_count + 1;
    UNLOCK();
  }
  else {
    (local_3e0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ->_M_use_count =
         (local_3e0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi)->_M_use_count + 1;
  }
LAB_0019e069:
  SPxSolverBase<double>::setTolerances(this_00,&local_3e0);
  if (local_3e0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3e0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_348.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_348.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_348.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_348.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_348.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_348.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_348.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setTolerances(local_370,&local_348);
  __r = &(this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount;
  if (local_348.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_348.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->_scalerUniequi).super_SPxScaler<double>._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_scalerUniequi).super_SPxScaler<double>._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,__r);
  (this->_scalerBiequi).super_SPxScaler<double>._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_scalerBiequi).super_SPxScaler<double>._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,__r);
  (this->_scalerGeo1).super_SPxScaler<double>._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_scalerGeo1).super_SPxScaler<double>._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,__r);
  (this->_scalerGeo8).super_SPxScaler<double>._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_scalerGeo8).super_SPxScaler<double>._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,__r);
  (this->_scalerGeoequi).super_SPxScaler<double>._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_scalerGeoequi).super_SPxScaler<double>._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,__r);
  (this->_scalerLeastsq).super_SPxScaler<double>._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_scalerLeastsq).super_SPxScaler<double>._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,__r);
  (this->_boostedScalerUniequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_boostedScalerUniequi).
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,__r);
  (this->_boostedScalerBiequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_boostedScalerBiequi).
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,__r);
  (this->_boostedScalerGeo1).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_boostedScalerGeo1).
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,__r);
  (this->_boostedScalerGeo8).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_boostedScalerGeo8).
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,__r);
  (this->_boostedScalerGeoequi).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_boostedScalerGeoequi).
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,__r);
  (this->_boostedScalerLeastsq).
  super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_boostedScalerLeastsq).
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,__r);
  this_04 = local_360;
  local_1b8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_1b8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_1b8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1b8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1b8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1b8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1b8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  SPxBoundFlippingRT<double>::setTolerances(local_368,&local_1b8);
  if (local_1b8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1b8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_1c8 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
  local_1c0._M_pi =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_1c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1c0._M_pi)->_M_use_count = (local_1c0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1c0._M_pi)->_M_use_count = (local_1c0._M_pi)->_M_use_count + 1;
    }
  }
  (this->_ratiotesterFast).super_SPxRatioTester<double>._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1c8;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_ratiotesterFast).super_SPxRatioTester<double>._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_1c0);
  if (local_1c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1c0._M_pi);
  }
  local_1d8 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
  local_1d0._M_pi =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_1d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1d0._M_pi)->_M_use_count = (local_1d0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1d0._M_pi)->_M_use_count = (local_1d0._M_pi)->_M_use_count + 1;
    }
  }
  (this->_ratiotesterHarris).super_SPxRatioTester<double>._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1d8;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_ratiotesterHarris).super_SPxRatioTester<double>._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_1d0);
  if (local_1d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d0._M_pi);
  }
  local_1e8 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
  local_1e0._M_pi =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1e0._M_pi)->_M_use_count = (local_1e0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1e0._M_pi)->_M_use_count = (local_1e0._M_pi)->_M_use_count + 1;
    }
  }
  (this->_ratiotesterTextbook).super_SPxRatioTester<double>._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1e8;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_ratiotesterTextbook).super_SPxRatioTester<double>._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_1e0);
  if (local_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e0._M_pi);
  }
  local_1f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_1f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_1f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setTolerances(this_01,&local_1f8);
  if (local_1f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_208 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
  local_200._M_pi =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_200._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_200._M_pi)->_M_use_count = (local_200._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_200._M_pi)->_M_use_count = (local_200._M_pi)->_M_use_count + 1;
    }
  }
  (this->_boostedRatiotesterFast).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_208
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_boostedRatiotesterFast).
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_200);
  if (local_200._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_200._M_pi);
  }
  local_218 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
  local_210._M_pi =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_210._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_210._M_pi)->_M_use_count = (local_210._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_210._M_pi)->_M_use_count = (local_210._M_pi)->_M_use_count + 1;
    }
  }
  (this->_boostedRatiotesterHarris).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_218
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_boostedRatiotesterHarris).
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_210);
  if (local_210._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_210._M_pi);
  }
  local_228 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
  local_220._M_pi =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_220._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_220._M_pi)->_M_use_count = (local_220._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_220._M_pi)->_M_use_count = (local_220._M_pi)->_M_use_count + 1;
    }
  }
  (this->_boostedRatiotesterTextbook).
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_228
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_boostedRatiotesterTextbook).
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_220);
  if (local_220._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_220._M_pi);
  }
  local_238.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_238.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_238.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_238.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_238.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_238.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_238.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  SLUFactor<double>::setTolerances(this_04,&local_238);
  if (local_238.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_238.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_248.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_248.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_248.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_248.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_248.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_248.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_248.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setTolerances(local_378,&local_248);
  if (local_248.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_248.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->_solver).spxout = pSVar5;
  (this->_solver).super_SPxLPBase<double>.spxout = pSVar5;
  (this->_scalerUniequi).super_SPxScaler<double>.spxout = pSVar5;
  (this->_scalerBiequi).super_SPxScaler<double>.spxout = pSVar5;
  (this->_scalerGeo1).super_SPxScaler<double>.spxout = pSVar5;
  (this->_scalerGeo8).super_SPxScaler<double>.spxout = pSVar5;
  (this->_scalerGeoequi).super_SPxScaler<double>.spxout = pSVar5;
  (this->_scalerLeastsq).super_SPxScaler<double>.spxout = pSVar5;
  (this->_slufactor).super_SLinSolver<double>.spxout = pSVar5;
  SPxBasisBase<double>::loadBasisSolver
            (&(this->_solver).super_SPxBasisBase<double>,&this_04->super_SLinSolver<double>,false);
  p = &this->_statistics;
  this->_realLP = &this_00->super_SPxLPBase<double>;
  this->_isRealLPLoaded = true;
  this->_isRealLPScaled = false;
  this->_applyPolishing = false;
  this->_optimizeCalls = 0;
  this->_unscaleCalls = 0;
  (this->_solver).super_SPxLPBase<double>.spxout = pSVar5;
  spx_alloc<soplex::SoPlexBase<double>::Statistics*>(p,1);
  this_03 = *p;
  Statistics::Statistics(this_03,USER_TIME);
  *p = this_03;
  spx_alloc<soplex::SoPlexBase<double>::Settings*>(&this->_currentSettings,1);
  newSettings = this->_currentSettings;
  lVar6 = 0;
  do {
    newSettings->_boolParamValues[lVar6] = (bool)(&DAT_006a9d98)[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x1a);
  lVar6 = 0;
  do {
    newSettings->_intParamValues[lVar6] = (&DAT_006aa4c0)[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x1c);
  lVar6 = 0;
  do {
    newSettings->_realParamValues[lVar6] = (Real)(&DAT_006aacd8)[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x1b);
  setSettings(this,newSettings,true);
  this->_lastSolveMode = this->_currentSettings->_intParamValues[0x11];
  (this->_simplifierPaPILO).super_SPxSimplifier<double>.spxout = pSVar5;
  return;
}

Assistant:

SoPlexBase<R>::SoPlexBase()
   : _statistics(nullptr)
   , _currentSettings(nullptr)
   , _scalerUniequi(false)
   , _scalerBiequi(true)
   , _scalerGeo1(false, 1)
   , _scalerGeo8(false, 8)
   , _scalerGeoequi(true)
   , _scalerLeastsq()
   , _simplifier(nullptr)
   , _scaler(nullptr)
   , _starter(nullptr)
   , _rationalLP(nullptr)
   , _unitMatrixRational(0)
   , _status(SPxSolverBase<R>::UNKNOWN)
   , _hasBasis(false)
   , _hasSolReal(false)
   , _hasSolRational(false)
   , _rationalPosone(1)
   , _rationalNegone(-1)
   , _rationalZero(0)
{
   _tolerances = std::make_shared<Tolerances>();
   _solver.setTolerances(_tolerances);
   _boostedSolver.setTolerances(_tolerances);
   // set tolerances for scalers
   _scalerUniequi.setTolerances(_tolerances);
   _scalerBiequi.setTolerances(_tolerances);
   _scalerGeo1.setTolerances(_tolerances);
   _scalerGeo8.setTolerances(_tolerances);
   _scalerGeoequi.setTolerances(_tolerances);
   _scalerLeastsq.setTolerances(_tolerances);

   _boostedScalerUniequi.setTolerances(_tolerances);
   _boostedScalerBiequi.setTolerances(_tolerances);
   _boostedScalerGeo1.setTolerances(_tolerances);
   _boostedScalerGeo8.setTolerances(_tolerances);
   _boostedScalerGeoequi.setTolerances(_tolerances);
   _boostedScalerLeastsq.setTolerances(_tolerances);

   // set tolerances for ratio testers
   _ratiotesterBoundFlipping.setTolerances(_tolerances);
   _ratiotesterFast.setTolerances(_tolerances);
   _ratiotesterHarris.setTolerances(_tolerances);
   _ratiotesterTextbook.setTolerances(_tolerances);

   _boostedRatiotesterBoundFlipping.setTolerances(_tolerances);
   _boostedRatiotesterFast.setTolerances(_tolerances);
   _boostedRatiotesterHarris.setTolerances(_tolerances);
   _boostedRatiotesterTextbook.setTolerances(_tolerances);

   // set tolerances for slufactor
   _slufactor.setTolerances(_tolerances);
   _boostedSlufactor.setTolerances(_tolerances);
   // transfer message handler
   _solver.setOutstream(spxout);
   _scalerUniequi.setOutstream(spxout);
   _scalerBiequi.setOutstream(spxout);
   _scalerGeo1.setOutstream(spxout);
   _scalerGeo8.setOutstream(spxout);
   _scalerGeoequi.setOutstream(spxout);
   _scalerLeastsq.setOutstream(spxout);

   // give lu factorization to solver
   _solver.setBasisSolver(&_slufactor);

#ifdef SOPLEX_WITH_MPFR
   // set initial precision
   BP::default_precision(_initialPrecision);

   _boostedSolver.setOutstream(spxout);
   _boostedScalerUniequi.setOutstream(spxout);
   _boostedScalerBiequi.setOutstream(spxout);
   _boostedScalerGeo1.setOutstream(spxout);
   _boostedScalerGeo8.setOutstream(spxout);
   _boostedScalerGeoequi.setOutstream(spxout);
   _boostedScalerLeastsq.setOutstream(spxout);

   _boostedSolver.setBasisSolver(&_boostedSlufactor);

   _lastStallPrecBoosts = 0;
   _factorSolNewBasisPrecBoost = true;
   _nextRatrecPrecBoost = 0;
   _prevIterations = 0;

   _switchedToBoosted = false;

   _certificateMode = 0;
   _hasOldBasis     = false;
   _hasOldFeasBasis = false;
   _hasOldUnbdBasis = false;

   _boostingLimitReached = false;
#endif

   // the R LP is initially stored in the solver; the rational LP is constructed, when the parameter SYNCMODE is
   // initialized in setSettings() below
   _realLP = &_solver;
   _isRealLPLoaded = true;
   _isRealLPScaled = false;
   _applyPolishing = false;
   _optimizeCalls = 0;
   _unscaleCalls = 0;
   _realLP->setOutstream(spxout);

   // initialize statistics
   spx_alloc(_statistics);
   _statistics = new(_statistics) Statistics();

   // initialize parameter settings to default
   spx_alloc(_currentSettings);
   _currentSettings = new(_currentSettings) Settings();
   setSettings(*_currentSettings, true);

   _lastSolveMode = intParam(SoPlexBase<R>::SOLVEMODE);

   _simplifierPaPILO.setOutstream(spxout);

   assert(_isConsistent());
}